

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cc
# Opt level: O3

void __thiscall t_client_wrapper::f_on_message(t_client_wrapper *this,wstring_view a_message)

{
  t_object *ptVar1;
  t_object *a_key;
  t_pvalue *a_stack;
  long *plVar2;
  t_object *ptVar3;
  t_pvalue local_38;
  
  ptVar1 = this->v_self;
  a_key = *(t_object **)(((ptVar1->v_type->v_module).v_p._M_b._M_p)->v_data + 0x10);
  plVar2 = (long *)__tls_get_addr(&PTR_0010fec8);
  if (a_message._M_len == 0) {
    ptVar3 = *(t_object **)(*plVar2 + 0x2e8);
  }
  else {
    ptVar3 = xemmai::t_type_of<xemmai::t_string>::f__construct
                       (*(t_type **)(*plVar2 + 0x198),a_message._M_str,a_message._M_len);
  }
  plVar2 = (long *)__tls_get_addr(&PTR_0010ff30);
  a_stack = (t_pvalue *)*plVar2;
  *plVar2 = (long)(a_stack + 3);
  a_stack[2].super_t_pointer.v_p = ptVar3;
  a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
  local_38.super_t_pointer.v_p = ptVar1;
  xemmai::t_type_of<xemmai::t_object>::f_invoke
            (ptVar1->v_type,&local_38,a_key,&f_on_message::index,a_stack,1);
  *plVar2 = (long)a_stack;
  return;
}

Assistant:

virtual void f_on_message(std::wstring_view a_message)
	{
		auto& library = v_self->f_type()->v_module->f_as<t_callback_library>();
		static size_t index;
		v_self->f_invoke(library.v_symbol_on_message, index, library.f_as(a_message));
	}